

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ipfs.c
# Opt level: O3

CURLcode ipfs_url_rewrite(CURLU *uh,char *protocol,char **url,OperationConfig *config)

{
  int iVar1;
  CURLcode CVar2;
  long lVar3;
  FILE *__stream;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  CURLcode CVar7;
  char *pcVar8;
  char **ppcVar9;
  char *cid;
  char *inputpath;
  char *gwport;
  char *gwscheme;
  char *gwpath;
  char *gwhost;
  char *gwquery;
  char *cloneurl;
  undefined1 local_a9;
  char *local_a8;
  long local_a0;
  char *local_98;
  undefined8 local_90;
  undefined8 local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  char **local_68;
  undefined8 local_60;
  char *local_58;
  dynbuf local_50;
  
  pcVar8 = (char *)0x0;
  local_78 = 0;
  local_80 = (char *)0x0;
  local_60 = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = (char *)0x0;
  local_a0 = 0;
  lVar3 = curl_url();
  if (lVar3 == 0) {
    CVar7 = CURLE_FAILED_INIT;
  }
  else {
    local_68 = url;
    iVar1 = curl_url_get(uh,5,&local_a0,0x40);
    pcVar8 = (char *)0x0;
    CVar7 = CURLE_URL_MALFORMAT;
    if ((iVar1 == 0) && (local_a0 != 0)) {
      if (config->ipfs_gateway == (char *)0x0) {
        local_70 = (char *)curl_getenv("IPFS_GATEWAY");
        if (local_70 == (char *)0x0) {
          local_58 = (char *)curl_getenv("IPFS_PATH");
          if (local_58 == (char *)0x0) {
            pcVar8 = getenv("HOME");
            if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
              pcVar5 = (char *)0x0;
            }
            else {
              pcVar5 = (char *)0x0;
              local_58 = (char *)curl_maprintf("%s/.ipfs/",pcVar8);
              if (local_58 != (char *)0x0) goto LAB_00113944;
            }
          }
          else {
LAB_00113944:
            CVar2 = ensure_trailing_slash(&local_58);
            pcVar5 = local_58;
            if (CVar2 == CURLE_OK) {
              local_a8 = local_58;
              pcVar8 = (char *)curl_maprintf("%sgateway",local_58);
              if (pcVar8 != (char *)0x0) {
                __stream = fopen64(pcVar8,"r");
                free(pcVar8);
                if (__stream != (FILE *)0x0) {
                  curlx_dyn_init(&local_50,10000);
                  do {
                    iVar1 = getc(__stream);
                    if ((iVar1 + 1U < 0xf) && ((0x4801U >> (iVar1 + 1U & 0x1f) & 1) != 0)) {
                      fclose(__stream);
                      sVar6 = curlx_dyn_len(&local_50);
                      if ((sVar6 == 0) ||
                         ((local_70 = curlx_dyn_ptr(&local_50), local_70 == (char *)0x0 ||
                          (ensure_trailing_slash(&local_70), pcVar8 = local_70,
                          local_70 == (char *)0x0)))) goto LAB_00113ca4;
                      free(local_a8);
                      goto LAB_00113a04;
                    }
                    local_a9 = (undefined1)iVar1;
                    CVar2 = curlx_dyn_addn(&local_50,&local_a9,1);
                  } while (CVar2 == CURLE_OK);
                  fclose(__stream);
                }
              }
LAB_00113ca4:
              pcVar8 = (char *)0x0;
              pcVar5 = local_a8;
              goto LAB_00113ca9;
            }
          }
          pcVar8 = (char *)0x0;
LAB_00113ca9:
          free(pcVar8);
          free(pcVar5);
        }
        else {
          CVar2 = ensure_trailing_slash(&local_70);
          if (CVar2 != CURLE_OK) {
            pcVar8 = local_70;
            pcVar5 = (char *)0x0;
            goto LAB_00113ca9;
          }
          pcVar8 = local_70;
          if (local_70 != (char *)0x0) {
LAB_00113a04:
            lVar4 = 0;
            iVar1 = curl_url_set(lVar3,0,pcVar8,0);
            if (iVar1 != 0) goto LAB_00113cc4;
            goto LAB_00113a34;
          }
        }
        CVar7 = CURLE_FILE_COULDNT_READ_FILE;
      }
      else {
        ppcVar9 = &config->ipfs_gateway;
        CVar2 = ensure_trailing_slash(ppcVar9);
        if (CVar2 == CURLE_OK) {
          pcVar8 = (char *)0x0;
          iVar1 = curl_url_set(lVar3,0,*ppcVar9,0x200);
          if (iVar1 == 0) {
            pcVar8 = strdup(*ppcVar9);
            if (pcVar8 == (char *)0x0) goto LAB_00113cbe;
LAB_00113a34:
            lVar4 = 0;
            iVar1 = curl_url_get(lVar3,8,&local_60,0);
            if (iVar1 != 0x10) goto LAB_00113cc4;
            iVar1 = curl_url_get(lVar3,5,&local_78,0x40);
            if ((iVar1 == 0) && (iVar1 = curl_url_get(lVar3,1,&local_88,0x40), iVar1 == 0)) {
              curl_url_get(lVar3,6,&local_90,0x40);
              curl_url_get(lVar3,7,&local_80,0x40);
              curl_url_get(uh,7,&local_98,0x40);
              iVar1 = curl_url_set(uh,1,local_88,0x80);
              if ((iVar1 == 0) &&
                 ((iVar1 = curl_url_set(uh,5,local_78,0x80), iVar1 == 0 &&
                  (iVar1 = curl_url_set(uh,6,local_90,0x80), iVar1 == 0)))) {
                if ((local_98 != (char *)0x0) && ((*local_98 == '/' && (local_98[1] == '\0')))) {
                  *local_98 = '\0';
                }
                ensure_trailing_slash(&local_80);
                pcVar5 = "";
                if (local_98 != (char *)0x0) {
                  pcVar5 = local_98;
                }
                lVar4 = curl_maprintf("%s%s/%s%s",local_80,protocol,local_a0,pcVar5);
                if (lVar4 != 0) {
                  iVar1 = curl_url_set(uh,7,lVar4,0x80);
                  ppcVar9 = local_68;
                  if (iVar1 == 0) {
                    free(*local_68);
                    *ppcVar9 = (char *)0x0;
                    iVar1 = curl_url_get(uh,0,&local_50,0x80);
                    if (iVar1 == 0) {
                      pcVar5 = strdup(local_50.bufr);
                      ppcVar9 = local_68;
                      *local_68 = pcVar5;
                      curl_free(local_50.bufr);
                      CVar7 = (uint)(*ppcVar9 == (char *)0x0) * 3;
                    }
                  }
                  goto LAB_00113cc4;
                }
              }
            }
          }
          else {
            CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
          }
          goto LAB_00113cc1;
        }
        CVar7 = CURLE_OUT_OF_MEMORY;
      }
LAB_00113cbe:
      pcVar8 = (char *)0x0;
    }
  }
LAB_00113cc1:
  lVar4 = 0;
LAB_00113cc4:
  free(pcVar8);
  curl_free(local_78);
  curl_free(local_80);
  curl_free(local_60);
  curl_free(local_98);
  curl_free(local_88);
  curl_free(local_90);
  curl_free(local_a0);
  curl_free(lVar4);
  curl_url_cleanup(lVar3);
  if (CVar7 == CURLE_URL_MALFORMAT) {
    pcVar8 = "malformed target URL";
  }
  else if (CVar7 == CURLE_BAD_FUNCTION_ARGUMENT) {
    pcVar8 = "--ipfs-gateway was given a malformed URL";
  }
  else {
    if (CVar7 != CURLE_FILE_COULDNT_READ_FILE) {
      return CVar7;
    }
    pcVar8 = "IPFS automatic gateway detection failed";
  }
  helpf(tool_stderr,pcVar8);
  return CVar7;
}

Assistant:

CURLcode ipfs_url_rewrite(CURLU *uh, const char *protocol, char **url,
                          struct OperationConfig *config)
{
  CURLcode result = CURLE_URL_MALFORMAT;
  CURLUcode getResult;
  char *gateway = NULL;
  char *gwhost = NULL;
  char *gwpath = NULL;
  char *gwquery = NULL;
  char *gwscheme = NULL;
  char *gwport = NULL;
  char *inputpath = NULL;
  char *cid = NULL;
  char *pathbuffer = NULL;
  char *cloneurl;
  CURLU *gatewayurl = curl_url();

  if(!gatewayurl) {
    result = CURLE_FAILED_INIT;
    goto clean;
  }

  getResult = curl_url_get(uh, CURLUPART_HOST, &cid, CURLU_URLDECODE);
  if(getResult || !cid)
    goto clean;

  /* We might have a --ipfs-gateway argument. Check it first and use it. Error
   * if we do have something but if it is an invalid url.
   */
  if(config->ipfs_gateway) {
    /* ensure the gateway ends in a trailing / */
    if(ensure_trailing_slash(&config->ipfs_gateway) != CURLE_OK) {
      result = CURLE_OUT_OF_MEMORY;
      goto clean;
    }

    if(!curl_url_set(gatewayurl, CURLUPART_URL, config->ipfs_gateway,
                    CURLU_GUESS_SCHEME)) {
      gateway = strdup(config->ipfs_gateway);
      if(!gateway) {
        result = CURLE_URL_MALFORMAT;
        goto clean;
      }

    }
    else {
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto clean;
    }
  }
  else {
    /* this is ensured to end in a trailing / within ipfs_gateway() */
    gateway = ipfs_gateway();
    if(!gateway) {
      result = CURLE_FILE_COULDNT_READ_FILE;
      goto clean;
    }

    if(curl_url_set(gatewayurl, CURLUPART_URL, gateway, 0)) {
      result = CURLE_URL_MALFORMAT;
      goto clean;
    }
  }

  /* check for unsupported gateway parts */
  if(curl_url_get(gatewayurl, CURLUPART_QUERY, &gwquery, 0)
                  != CURLUE_NO_QUERY) {
    result = CURLE_URL_MALFORMAT;
    goto clean;
  }

  /* get gateway parts */
  if(curl_url_get(gatewayurl, CURLUPART_HOST,
                  &gwhost, CURLU_URLDECODE)) {
    goto clean;
  }

  if(curl_url_get(gatewayurl, CURLUPART_SCHEME,
                  &gwscheme, CURLU_URLDECODE)) {
    goto clean;
  }

  curl_url_get(gatewayurl, CURLUPART_PORT, &gwport, CURLU_URLDECODE);
  curl_url_get(gatewayurl, CURLUPART_PATH, &gwpath, CURLU_URLDECODE);

  /* get the path from user input */
  curl_url_get(uh, CURLUPART_PATH, &inputpath, CURLU_URLDECODE);
  /* inputpath might be NULL or a valid pointer now */

  /* set gateway parts in input url */
  if(curl_url_set(uh, CURLUPART_SCHEME, gwscheme, CURLU_URLENCODE) ||
     curl_url_set(uh, CURLUPART_HOST, gwhost, CURLU_URLENCODE) ||
     curl_url_set(uh, CURLUPART_PORT, gwport, CURLU_URLENCODE))
    goto clean;

  /* if the input path is just a slash, clear it */
  if(inputpath && (inputpath[0] == '/') && !inputpath[1])
    *inputpath = '\0';

  /* ensure the gateway path ends with a trailing slash */
  ensure_trailing_slash(&gwpath);

  pathbuffer = aprintf("%s%s/%s%s", gwpath, protocol, cid,
                       inputpath ? inputpath : "");
  if(!pathbuffer) {
    goto clean;
  }

  if(curl_url_set(uh, CURLUPART_PATH, pathbuffer, CURLU_URLENCODE)) {
    goto clean;
  }

  /* Free whatever it has now, rewriting is next */
  Curl_safefree(*url);

  if(curl_url_get(uh, CURLUPART_URL, &cloneurl, CURLU_URLENCODE)) {
    goto clean;
  }
  /* we need to strdup the URL so that we can call free() on it later */
  *url = strdup(cloneurl);
  curl_free(cloneurl);
  if(!*url)
    goto clean;

  result = CURLE_OK;

clean:
  free(gateway);
  curl_free(gwhost);
  curl_free(gwpath);
  curl_free(gwquery);
  curl_free(inputpath);
  curl_free(gwscheme);
  curl_free(gwport);
  curl_free(cid);
  curl_free(pathbuffer);
  curl_url_cleanup(gatewayurl);
  {
    switch(result) {
    case CURLE_URL_MALFORMAT:
      helpf(tool_stderr, "malformed target URL");
      break;
    case CURLE_FILE_COULDNT_READ_FILE:
      helpf(tool_stderr, "IPFS automatic gateway detection failed");
      break;
    case CURLE_BAD_FUNCTION_ARGUMENT:
      helpf(tool_stderr, "--ipfs-gateway was given a malformed URL");
      break;
    default:
      break;
    }
  }
  return result;
}